

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

bool CConnman::NodeFullyConnected(CNode *pnode)

{
  byte bVar1;
  long in_FS_OFFSET;
  
  if ((pnode == (CNode *)0x0) || (((pnode->fSuccessfullyConnected)._M_base._M_i & 1U) == 0)) {
    bVar1 = 0;
  }
  else {
    bVar1 = (pnode->fDisconnect)._M_base._M_i ^ 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool CConnman::NodeFullyConnected(const CNode* pnode)
{
    return pnode && pnode->fSuccessfullyConnected && !pnode->fDisconnect;
}